

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_io.cc
# Opt level: O0

void __thiscall gimage::JPEGImageIO::save(JPEGImageIO *this,ImageU8 *image,char *name)

{
  store_t sVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  IOException *this_00;
  undefined8 uVar5;
  long lVar6;
  char *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  int j;
  long i;
  JSAMPROW rp;
  long k;
  FILE *out;
  JSAMPROW row;
  jpeg_error_mgr jerr;
  jpeg_compress_struct cinfo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffb9c;
  string *in_stack_fffffffffffffbc8;
  allocator *message;
  IOException *in_stack_fffffffffffffbd0;
  int local_414;
  long local_410;
  store_t *local_408;
  long local_400;
  allocator local_3f1;
  string local_3f0 [99];
  undefined1 local_38d;
  allocator local_379;
  string local_378 [96];
  FILE *local_318;
  store_t *local_310;
  undefined1 local_308 [168];
  undefined8 local_260 [6];
  undefined4 local_230;
  undefined4 local_22c;
  int local_228;
  undefined4 local_224;
  char *local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_310 = (store_t *)0x0;
  local_318 = (FILE *)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar4 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,0);
  if (((uVar4 & 1) != 0) &&
     ((iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
      iVar2 == 1 ||
      (iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
      iVar2 == 3)))) {
    local_318 = fopen(local_18,"wb");
    if (local_318 != (FILE *)0x0) {
      local_260[0] = jpeg_std_error(local_308);
      jpeg_CreateCompress(local_260,0x50,0x248);
      jpeg_stdio_dest(local_260,local_318);
      lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
      local_230 = (undefined4)lVar6;
      lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
      local_22c = (undefined4)lVar6;
      local_228 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
      local_224 = 1;
      iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
      if (iVar2 == 3) {
        local_224 = 2;
      }
      jpeg_set_defaults(local_260);
      jpeg_set_quality(local_260,0x5a,1);
      jpeg_start_compress(local_260,1);
      lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
      iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
      uVar4 = lVar6 * iVar2;
      if ((long)uVar4 < 0) {
        uVar4 = 0xffffffffffffffff;
      }
      local_310 = (store_t *)operator_new__(uVar4);
      for (local_400 = 0;
          lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10),
          local_400 < lVar6; local_400 = local_400 + 1) {
        local_408 = local_310;
        for (local_410 = 0;
            lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10),
            local_410 < lVar6; local_410 = local_410 + 1) {
          local_414 = 0;
          while (iVar2 = local_414,
                iVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth
                                  (local_10), iVar2 < iVar3) {
            sVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                              (local_10,local_410,local_400,local_414);
            *local_408 = sVar1;
            local_414 = local_414 + 1;
            local_408 = local_408 + 1;
          }
        }
        jpeg_write_scanlines(local_260,&local_310,1);
      }
      jpeg_finish_compress(local_260);
      if (local_310 != (store_t *)0x0) {
        operator_delete__(local_310);
      }
      fclose(local_318);
      jpeg_destroy_compress(local_260);
      return;
    }
    uVar5 = __cxa_allocate_exception(0x28);
    message = &local_3f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f0,local_18,message);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   in_stack_fffffffffffffb90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                   (char *)in_stack_fffffffffffffb90);
    gutil::IOException::IOException(in_stack_fffffffffffffbd0,(string *)message);
    __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_38d = 1;
  this_00 = (IOException *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_378,local_18,&local_379);
  std::operator+((char *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 in_stack_fffffffffffffb90);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
                 (char *)in_stack_fffffffffffffb90);
  gutil::IOException::IOException(this_00,in_stack_fffffffffffffbc8);
  local_38d = 0;
  __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void JPEGImageIO::save(const ImageU8 &image, const char *name) const
{
  struct jpeg_compress_struct cinfo;
  struct jpeg_error_mgr jerr;
  JSAMPROW row=0;
  FILE   *out=0;

  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save JPG images with depth 1 or 3 ("+std::string(name)+")");
  }

  // open output file using C methods

  out=fopen(name, "wb");

  if (out == 0)
  {
    throw gutil::IOException("Cannot open file for writing ("+std::string(name)+")");
  }

  // installing standard error handler, create compression object and set output file

  cinfo.err=jpeg_std_error(&jerr);
  jpeg_create_compress(&cinfo);
  jpeg_stdio_dest(&cinfo, out);

  // set image size, color space and quality

  cinfo.image_width=static_cast<JDIMENSION>(image.getWidth());
  cinfo.image_height=static_cast<JDIMENSION>(image.getHeight());
  cinfo.input_components=image.getDepth();

  cinfo.in_color_space=JCS_GRAYSCALE;

  if (image.getDepth() == 3)
  {
    cinfo.in_color_space=JCS_RGB;
  }

  jpeg_set_defaults(&cinfo);
  jpeg_set_quality(&cinfo, 90, TRUE);

  // start compression

  jpeg_start_compress(&cinfo, TRUE);
  row=new JSAMPLE [image.getWidth()*image.getDepth()];

  // write image content line by line

  for (long k=0; k<image.getHeight(); k++)
  {
    JSAMPROW rp=row;

    for (long i=0; i<image.getWidth(); i++)
    {
      for (int j=0; j<image.getDepth(); j++)
      {
        *rp++=static_cast<JSAMPLE>(image.get(i, k, j));
      }
    }

    jpeg_write_scanlines(&cinfo, &row, 1);
  }

  // finish compression and close stream

  jpeg_finish_compress(&cinfo);
  delete [] row;

  fclose(out);

  jpeg_destroy_compress(&cinfo);
}